

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

void __thiscall FConsoleAlias::Run(FConsoleAlias *this,FCommandLine *args,APlayerPawn *who,int key)

{
  bool bVar1;
  char *cmd;
  uint uVar2;
  FString local_58;
  FString local_50 [3];
  FString local_38;
  FString mycommand;
  FString savedcommand;
  int index;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *args_local;
  FConsoleAlias *this_local;
  
  if ((this->bRunning & 1U) == 0) {
    bVar1 = FString::IsEmpty(this->m_Command + 1);
    uVar2 = (uint)!bVar1;
    FString::FString(&mycommand,this->m_Command + (int)uVar2);
    FString::FString(&local_38);
    FString::FString(local_50);
    FString::operator=(this->m_Command + (int)uVar2,local_50);
    FString::~FString(local_50);
    if ((this->bDoSubstitution & 1U) == 0) {
      FString::operator=(&local_38,&mycommand);
    }
    else {
      SubstituteAliasParams(&local_58,(FCommandLine *)&mycommand);
      FString::operator=(&local_38,&local_58);
      FString::~FString(&local_58);
    }
    this->bRunning = true;
    cmd = FString::LockBuffer(&local_38);
    AddCommandString(cmd,key);
    FString::UnlockBuffer(&local_38);
    this->bRunning = false;
    bVar1 = FString::IsEmpty(this->m_Command + (int)uVar2);
    if (bVar1) {
      FString::operator=(this->m_Command + (int)uVar2,&mycommand);
    }
    if (((this->bKill & 1U) != 0) && (this != (FConsoleAlias *)0x0)) {
      (*(this->super_FConsoleCommand)._vptr_FConsoleCommand[1])();
    }
    FString::~FString(&local_38);
    FString::~FString(&mycommand);
  }
  else {
    Printf("Alias %s tried to recurse.\n",(this->super_FConsoleCommand).m_Name);
  }
  return;
}

Assistant:

void FConsoleAlias::Run (FCommandLine &args, APlayerPawn *who, int key)
{
	if (bRunning)
	{
		Printf ("Alias %s tried to recurse.\n", m_Name);
		return;
	}

	int index = !m_Command[1].IsEmpty();
	FString savedcommand = m_Command[index], mycommand;
	m_Command[index] = FString();

	if (bDoSubstitution)
	{
		mycommand = SubstituteAliasParams (savedcommand, args);
	}
	else
	{
		mycommand = savedcommand;
	}

	bRunning = true;
	AddCommandString (mycommand.LockBuffer(), key);
	mycommand.UnlockBuffer();
	bRunning = false;
	if (m_Command[index].IsEmpty())
	{ // The alias is unchanged, so put the command back so it can be used again.
	  // If the command had been non-empty, then that means that executing this
	  // alias caused it to realias itself, so the old command will be forgotten
	  // once this function returns.
		m_Command[index] = savedcommand;
	}
	if (bKill)
	{ // The alias wants to remove itself
		delete this;
	}
}